

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharContent.cpp
# Opt level: O3

vector<CharContent,_std::allocator<CharContent>_> * __thiscall
CharContent::split(vector<CharContent,_std::allocator<CharContent>_> *__return_storage_ptr__,
                  CharContent *this,CharContent *s)

{
  size_t sVar1;
  size_t sVar2;
  char *s_00;
  ulong pos;
  size_t sVar3;
  CharContent local_60;
  CharContent *local_38;
  
  (__return_storage_ptr__->super__Vector_base<CharContent,_std::allocator<CharContent>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CharContent,_std::allocator<CharContent>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CharContent,_std::allocator<CharContent>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  s_00 = s->m;
  sVar2 = s->size;
  pos = 0;
  local_38 = s;
  sVar1 = find(this,s_00,sVar2,0);
  sVar3 = this->npos;
  if (sVar1 != sVar3) {
    pos = 0;
    do {
      if (pos <= sVar1 && sVar1 - pos != 0) {
        subCharContent(&local_60,this,pos,sVar1 - pos);
        std::vector<CharContent,_std::allocator<CharContent>_>::emplace_back<CharContent>
                  (__return_storage_ptr__,&local_60);
        local_60._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
        if (local_60.m != (char *)0x0) {
          operator_delete__(local_60.m);
        }
        s_00 = local_38->m;
        sVar2 = local_38->size;
        sVar3 = this->npos;
      }
      pos = sVar1 + sVar2;
      sVar1 = find(this,s_00,sVar2,pos);
    } while (sVar1 != sVar3);
  }
  sVar2 = this->size - pos;
  if (pos <= this->size && sVar2 != 0) {
    subCharContent(&local_60,this,pos,sVar2);
    std::vector<CharContent,_std::allocator<CharContent>_>::emplace_back<CharContent>
              (__return_storage_ptr__,&local_60);
    local_60._vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
    if (local_60.m != (char *)0x0) {
      operator_delete__(local_60.m);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CharContent> CharContent::split(const CharContent &s){
	std::vector<CharContent> ans;
	size_t start=0,pos=0;
	while((pos=this->find(s,start))!=this->npos){
		if(pos>start)
			ans.push_back(this->subCharContent(start,pos-start));
		start=pos+s.length();
	}
	if(start<this->size)
		ans.push_back(this->subCharContent(start,this->size-start));
	return ans;
}